

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha_blocks_ref.c
# Opt level: O3

void chacha_blocks_ref(chacha_state_conflict *state,uint8_t *in,uint8_t *out,size_t bytes)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  size_t sVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  bool bVar25;
  uint8_t tmp [64];
  uint local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint *local_c0;
  uint *local_b8;
  uint *local_b0;
  uint local_78 [18];
  
  if (bytes != 0) {
    uVar1 = *(uint *)state->s;
    uVar2 = *(uint *)(state->s + 4);
    uVar3 = *(uint *)(state->s + 8);
    uVar4 = *(uint *)(state->s + 0xc);
    uVar5 = *(uint *)(state->s + 0x10);
    uVar6 = *(uint *)(state->s + 0x14);
    uVar7 = *(uint *)(state->s + 0x18);
    uVar8 = *(uint *)(state->s + 0x1c);
    local_f8 = *(uint *)(state->s + 0x20);
    local_f4 = *(uint *)(state->s + 0x24);
    uVar9 = *(uint *)(state->s + 0x28);
    uVar10 = *(uint *)(state->s + 0x2c);
    sVar11 = state->rounds;
    local_b8 = (uint *)out;
    while( true ) {
      local_c0 = (uint *)out;
      local_b0 = (uint *)in;
      if (bytes < 0x40) {
        local_b8 = (uint *)out;
        if ((uint *)in == (uint *)0x0) {
          local_c0 = local_78;
          local_b0 = (uint *)0x0;
        }
        else {
          uVar13 = 0;
          do {
            *(undefined1 *)((long)local_78 + uVar13) = *(undefined1 *)((long)in + uVar13);
            uVar13 = uVar13 + 1;
          } while (uVar13 < bytes);
          local_c0 = local_78;
          local_b0 = local_c0;
        }
      }
      local_fc = 0x61707865;
      local_ec = 0x3320646e;
      local_108 = 0x79622d32;
      local_10c = 0x6b206574;
      sVar17 = sVar11;
      uVar22 = uVar9;
      uVar18 = uVar3;
      uVar14 = uVar2;
      uVar12 = uVar1;
      uVar19 = uVar4;
      uVar15 = uVar5;
      uVar24 = uVar6;
      uVar20 = local_f8;
      uVar16 = local_f4;
      local_104 = uVar8;
      local_100 = uVar10;
      local_f0 = uVar7;
      do {
        uVar20 = uVar20 ^ local_fc + uVar12;
        uVar21 = uVar20 << 0x10 | uVar20 >> 0x10;
        uVar15 = uVar15 + uVar21;
        uVar20 = uVar12 ^ uVar15;
        uVar20 = uVar20 << 0xc | uVar20 >> 0x14;
        local_fc = local_fc + uVar12 + uVar20;
        uVar21 = uVar21 ^ local_fc;
        uVar21 = uVar21 << 8 | uVar21 >> 0x18;
        uVar15 = uVar15 + uVar21;
        uVar20 = uVar20 ^ uVar15;
        uVar12 = uVar20 << 7 | uVar20 >> 0x19;
        uVar16 = uVar16 ^ local_ec + uVar14;
        uVar16 = uVar16 << 0x10 | uVar16 >> 0x10;
        uVar24 = uVar24 + uVar16;
        uVar20 = uVar14 ^ uVar24;
        uVar20 = uVar20 << 0xc | uVar20 >> 0x14;
        local_ec = local_ec + uVar14 + uVar20;
        uVar16 = uVar16 ^ local_ec;
        uVar16 = uVar16 << 8 | uVar16 >> 0x18;
        uVar24 = uVar24 + uVar16;
        uVar20 = uVar20 ^ uVar24;
        uVar14 = uVar20 << 7 | uVar20 >> 0x19;
        uVar22 = uVar22 ^ local_108 + uVar18;
        uVar20 = uVar22 << 0x10 | uVar22 >> 0x10;
        local_f0 = local_f0 + uVar20;
        uVar22 = uVar18 ^ local_f0;
        uVar22 = uVar22 << 0xc | uVar22 >> 0x14;
        local_108 = local_108 + uVar18 + uVar22;
        uVar20 = uVar20 ^ local_108;
        uVar23 = uVar20 << 8 | uVar20 >> 0x18;
        local_f0 = local_f0 + uVar23;
        uVar22 = uVar22 ^ local_f0;
        uVar20 = uVar22 << 7 | uVar22 >> 0x19;
        local_100 = local_100 ^ local_10c + uVar19;
        uVar18 = local_100 << 0x10 | local_100 >> 0x10;
        local_104 = local_104 + uVar18;
        uVar22 = uVar19 ^ local_104;
        uVar22 = uVar22 << 0xc | uVar22 >> 0x14;
        local_10c = local_10c + uVar19 + uVar22;
        uVar18 = uVar18 ^ local_10c;
        uVar18 = uVar18 << 8 | uVar18 >> 0x18;
        local_104 = local_104 + uVar18;
        uVar22 = uVar22 ^ local_104;
        uVar22 = uVar22 << 7 | uVar22 >> 0x19;
        local_fc = local_fc + uVar14;
        uVar18 = uVar18 ^ local_fc;
        uVar19 = uVar18 << 0x10 | uVar18 >> 0x10;
        local_f0 = local_f0 + uVar19;
        uVar14 = uVar14 ^ local_f0;
        uVar18 = uVar14 << 0xc | uVar14 >> 0x14;
        local_fc = local_fc + uVar18;
        uVar19 = uVar19 ^ local_fc;
        local_100 = uVar19 << 8 | uVar19 >> 0x18;
        local_f0 = local_f0 + local_100;
        uVar18 = uVar18 ^ local_f0;
        uVar14 = uVar18 << 7 | uVar18 >> 0x19;
        local_ec = local_ec + uVar20;
        uVar21 = uVar21 ^ local_ec;
        uVar19 = uVar21 << 0x10 | uVar21 >> 0x10;
        local_104 = local_104 + uVar19;
        uVar20 = uVar20 ^ local_104;
        uVar18 = uVar20 << 0xc | uVar20 >> 0x14;
        local_ec = local_ec + uVar18;
        uVar19 = uVar19 ^ local_ec;
        uVar20 = uVar19 << 8 | uVar19 >> 0x18;
        local_104 = local_104 + uVar20;
        uVar18 = uVar18 ^ local_104;
        uVar18 = uVar18 << 7 | uVar18 >> 0x19;
        local_108 = local_108 + uVar22;
        uVar16 = uVar16 ^ local_108;
        uVar19 = uVar16 << 0x10 | uVar16 >> 0x10;
        uVar15 = uVar15 + uVar19;
        uVar22 = uVar22 ^ uVar15;
        uVar22 = uVar22 << 0xc | uVar22 >> 0x14;
        local_108 = local_108 + uVar22;
        uVar19 = uVar19 ^ local_108;
        uVar16 = uVar19 << 8 | uVar19 >> 0x18;
        uVar15 = uVar15 + uVar16;
        uVar22 = uVar22 ^ uVar15;
        uVar19 = uVar22 << 7 | uVar22 >> 0x19;
        local_10c = local_10c + uVar12;
        uVar23 = uVar23 ^ local_10c;
        uVar22 = uVar23 << 0x10 | uVar23 >> 0x10;
        uVar24 = uVar24 + uVar22;
        uVar12 = uVar12 ^ uVar24;
        uVar12 = uVar12 << 0xc | uVar12 >> 0x14;
        local_10c = local_10c + uVar12;
        uVar22 = uVar22 ^ local_10c;
        uVar22 = uVar22 << 8 | uVar22 >> 0x18;
        uVar24 = uVar24 + uVar22;
        uVar12 = uVar12 ^ uVar24;
        uVar12 = uVar12 << 7 | uVar12 >> 0x19;
        sVar17 = sVar17 - 2;
      } while (sVar17 != 0);
      local_fc = local_fc + 0x61707865;
      local_ec = local_ec + 0x3320646e;
      local_108 = local_108 + 0x79622d32;
      local_10c = local_10c + 0x6b206574;
      uVar12 = uVar12 + uVar1;
      uVar14 = uVar14 + uVar2;
      uVar18 = uVar18 + uVar3;
      uVar19 = uVar19 + uVar4;
      uVar15 = uVar15 + uVar5;
      uVar24 = uVar24 + uVar6;
      local_f0 = local_f0 + uVar7;
      local_104 = local_104 + uVar8;
      uVar20 = uVar20 + local_f8;
      uVar16 = uVar16 + local_f4;
      uVar22 = uVar22 + uVar9;
      local_100 = local_100 + uVar10;
      if (local_b0 == (uint *)0x0) {
        *(char *)local_c0 = (char)local_fc;
        *(char *)((long)local_c0 + 1) = (char)(local_fc >> 8);
        *(char *)((long)local_c0 + 2) = (char)(local_fc >> 0x10);
        *(char *)((long)local_c0 + 3) = (char)(local_fc >> 0x18);
        *(char *)(local_c0 + 1) = (char)local_ec;
        *(char *)((long)local_c0 + 5) = (char)(local_ec >> 8);
        *(char *)((long)local_c0 + 6) = (char)(local_ec >> 0x10);
        *(char *)((long)local_c0 + 7) = (char)(local_ec >> 0x18);
        *(char *)(local_c0 + 2) = (char)local_108;
        *(char *)((long)local_c0 + 9) = (char)(local_108 >> 8);
        *(char *)((long)local_c0 + 10) = (char)(local_108 >> 0x10);
        *(char *)((long)local_c0 + 0xb) = (char)(local_108 >> 0x18);
        *(char *)(local_c0 + 3) = (char)local_10c;
        *(char *)((long)local_c0 + 0xd) = (char)(local_10c >> 8);
        *(char *)((long)local_c0 + 0xe) = (char)(local_10c >> 0x10);
        *(char *)((long)local_c0 + 0xf) = (char)(local_10c >> 0x18);
        *(char *)(local_c0 + 4) = (char)uVar12;
        *(char *)((long)local_c0 + 0x11) = (char)(uVar12 >> 8);
        *(char *)((long)local_c0 + 0x12) = (char)(uVar12 >> 0x10);
        *(char *)((long)local_c0 + 0x13) = (char)(uVar12 >> 0x18);
        *(char *)(local_c0 + 5) = (char)uVar14;
        *(char *)((long)local_c0 + 0x15) = (char)(uVar14 >> 8);
        *(char *)((long)local_c0 + 0x16) = (char)(uVar14 >> 0x10);
        *(char *)((long)local_c0 + 0x17) = (char)(uVar14 >> 0x18);
        *(char *)(local_c0 + 6) = (char)uVar18;
        *(char *)((long)local_c0 + 0x19) = (char)(uVar18 >> 8);
        *(char *)((long)local_c0 + 0x1a) = (char)(uVar18 >> 0x10);
        *(char *)((long)local_c0 + 0x1b) = (char)(uVar18 >> 0x18);
        *(char *)(local_c0 + 7) = (char)uVar19;
        *(char *)((long)local_c0 + 0x1d) = (char)(uVar19 >> 8);
        *(char *)((long)local_c0 + 0x1e) = (char)(uVar19 >> 0x10);
        *(char *)((long)local_c0 + 0x1f) = (char)(uVar19 >> 0x18);
        *(char *)(local_c0 + 8) = (char)uVar15;
        *(char *)((long)local_c0 + 0x21) = (char)(uVar15 >> 8);
        *(char *)((long)local_c0 + 0x22) = (char)(uVar15 >> 0x10);
        *(char *)((long)local_c0 + 0x23) = (char)(uVar15 >> 0x18);
        *(char *)(local_c0 + 9) = (char)uVar24;
        *(char *)((long)local_c0 + 0x25) = (char)(uVar24 >> 8);
        *(char *)((long)local_c0 + 0x26) = (char)(uVar24 >> 0x10);
        *(char *)((long)local_c0 + 0x27) = (char)(uVar24 >> 0x18);
        *(char *)(local_c0 + 10) = (char)local_f0;
        *(char *)((long)local_c0 + 0x29) = (char)(local_f0 >> 8);
        *(char *)((long)local_c0 + 0x2a) = (char)(local_f0 >> 0x10);
        *(char *)((long)local_c0 + 0x2b) = (char)(local_f0 >> 0x18);
        *(char *)(local_c0 + 0xb) = (char)local_104;
        *(char *)((long)local_c0 + 0x2d) = (char)(local_104 >> 8);
        *(char *)((long)local_c0 + 0x2e) = (char)(local_104 >> 0x10);
        *(char *)((long)local_c0 + 0x2f) = (char)(local_104 >> 0x18);
        *(char *)(local_c0 + 0xc) = (char)uVar20;
        *(char *)((long)local_c0 + 0x31) = (char)(uVar20 >> 8);
        *(char *)((long)local_c0 + 0x32) = (char)(uVar20 >> 0x10);
        *(char *)((long)local_c0 + 0x33) = (char)(uVar20 >> 0x18);
        *(char *)(local_c0 + 0xd) = (char)uVar16;
        *(char *)((long)local_c0 + 0x35) = (char)(uVar16 >> 8);
        *(char *)((long)local_c0 + 0x36) = (char)(uVar16 >> 0x10);
        *(char *)((long)local_c0 + 0x37) = (char)(uVar16 >> 0x18);
        *(char *)(local_c0 + 0xe) = (char)uVar22;
        *(char *)((long)local_c0 + 0x39) = (char)(uVar22 >> 8);
        *(char *)((long)local_c0 + 0x3a) = (char)(uVar22 >> 0x10);
        *(char *)((long)local_c0 + 0x3b) = (char)(uVar22 >> 0x18);
        *(char *)(local_c0 + 0xf) = (char)local_100;
        *(char *)((long)local_c0 + 0x3d) = (char)(local_100 >> 8);
        *(char *)((long)local_c0 + 0x3e) = (char)(local_100 >> 0x10);
        *(char *)((long)local_c0 + 0x3f) = (char)(local_100 >> 0x18);
        in = (uint8_t *)0x0;
      }
      else {
        *local_c0 = local_fc ^ *local_b0;
        local_c0[1] = local_ec ^ local_b0[1];
        local_c0[2] = local_108 ^ local_b0[2];
        local_c0[3] = local_10c ^ local_b0[3];
        local_c0[4] = uVar12 ^ local_b0[4];
        local_c0[5] = uVar14 ^ local_b0[5];
        local_c0[6] = uVar18 ^ local_b0[6];
        local_c0[7] = uVar19 ^ local_b0[7];
        local_c0[8] = uVar15 ^ local_b0[8];
        local_c0[9] = uVar24 ^ local_b0[9];
        local_c0[10] = local_f0 ^ local_b0[10];
        local_c0[0xb] = local_104 ^ local_b0[0xb];
        local_c0[0xc] = uVar20 ^ local_b0[0xc];
        local_c0[0xd] = uVar16 ^ local_b0[0xd];
        local_c0[0xe] = uVar22 ^ local_b0[0xe];
        local_c0[0xf] = local_100 ^ local_b0[0xf];
        in = (uint8_t *)(local_b0 + 0x10);
      }
      bVar25 = 0xfffffffe < local_f8;
      local_f8 = local_f8 + 1;
      local_f4 = local_f4 + bVar25;
      if (bytes < 0x41) break;
      out = (uint8_t *)(local_c0 + 0x10);
      bytes = bytes - 0x40;
    }
    if (bytes - 1 < 0x3f) {
      uVar13 = 0;
      do {
        *(undefined1 *)((long)local_b8 + uVar13) = *(undefined1 *)((long)local_c0 + uVar13);
        uVar13 = uVar13 + 1;
      } while (uVar13 < bytes);
    }
    state->s[0x20] = (uint8_t)local_f8;
    state->s[0x21] = (uint8_t)(local_f8 >> 8);
    state->s[0x22] = (uint8_t)(local_f8 >> 0x10);
    state->s[0x23] = (uint8_t)(local_f8 >> 0x18);
    state->s[0x24] = (uint8_t)local_f4;
    state->s[0x25] = (uint8_t)(local_f4 >> 8);
    state->s[0x26] = (uint8_t)(local_f4 >> 0x10);
    state->s[0x27] = (uint8_t)(local_f4 >> 0x18);
  }
  return;
}

Assistant:

void
chacha_blocks_ref(chacha_state *state, const uint8_t *in, uint8_t *out, size_t bytes) {
    uint32_t x[16], j[12];
    uint32_t t;
    uint8_t *ctarget = out, tmp[64];
    size_t i, r;

    if (!bytes) return;

    j[0] = U8TO32(state->s + 0);
    j[1] = U8TO32(state->s + 4);
    j[2] = U8TO32(state->s + 8);
    j[3] = U8TO32(state->s + 12);
    j[4] = U8TO32(state->s + 16);
    j[5] = U8TO32(state->s + 20);
    j[6] = U8TO32(state->s + 24);
    j[7] = U8TO32(state->s + 28);
    j[8] = U8TO32(state->s + 32);
    j[9] = U8TO32(state->s + 36);
    j[10] = U8TO32(state->s + 40);
    j[11] = U8TO32(state->s + 44);

    r = state->rounds;

    for (;;) {
        if (bytes < 64) {
            if (in) {
                for (i = 0; i < bytes; i++) tmp[i] = in[i];
                in = tmp;
            }
            ctarget = out;
            out = tmp;
        }

        x[0] = chacha_constants[0];
        x[1] = chacha_constants[1];
        x[2] = chacha_constants[2];
        x[3] = chacha_constants[3];
        x[4] = j[0];
        x[5] = j[1];
        x[6] = j[2];
        x[7] = j[3];
        x[8] = j[4];
        x[9] = j[5];
        x[10] = j[6];
        x[11] = j[7];
        x[12] = j[8];
        x[13] = j[9];
        x[14] = j[10];
        x[15] = j[11];

        #define quarter(a,b,c,d) \
            a += b; t = d^a; d = ROTL32(t,16); \
            c += d; t = b^c; b = ROTL32(t,12); \
            a += b; t = d^a; d = ROTL32(t, 8); \
            c += d; t = b^c; b = ROTL32(t, 7);

        #define doubleround() \
            quarter( x[0], x[4], x[8],x[12]) \
            quarter( x[1], x[5], x[9],x[13]) \
            quarter( x[2], x[6],x[10],x[14]) \
            quarter( x[3], x[7],x[11],x[15]) \
            quarter( x[0], x[5],x[10],x[15]) \
            quarter( x[1], x[6],x[11],x[12]) \
            quarter( x[2], x[7], x[8],x[13]) \
            quarter( x[3], x[4], x[9],x[14])

        i = r;
        do {
            doubleround()
            i -= 2;
        } while (i);

        x[0] += chacha_constants[0];
        x[1] += chacha_constants[1];
        x[2] += chacha_constants[2];
        x[3] += chacha_constants[3];
        x[4] += j[0];
        x[5] += j[1];
        x[6] += j[2];
        x[7] += j[3];
        x[8] += j[4];
        x[9] += j[5];
        x[10] += j[6];
        x[11] += j[7];
        x[12] += j[8];
        x[13] += j[9];
        x[14] += j[10];
        x[15] += j[11];

        if (in) {
            U32TO8(out +  0,  x[0] ^ U8TO32(in +  0));
            U32TO8(out +  4,  x[1] ^ U8TO32(in +  4));
            U32TO8(out +  8,  x[2] ^ U8TO32(in +  8));
            U32TO8(out + 12,  x[3] ^ U8TO32(in + 12));
            U32TO8(out + 16,  x[4] ^ U8TO32(in + 16));
            U32TO8(out + 20,  x[5] ^ U8TO32(in + 20));
            U32TO8(out + 24,  x[6] ^ U8TO32(in + 24));
            U32TO8(out + 28,  x[7] ^ U8TO32(in + 28));
            U32TO8(out + 32,  x[8] ^ U8TO32(in + 32));
            U32TO8(out + 36,  x[9] ^ U8TO32(in + 36));
            U32TO8(out + 40, x[10] ^ U8TO32(in + 40));
            U32TO8(out + 44, x[11] ^ U8TO32(in + 44));
            U32TO8(out + 48, x[12] ^ U8TO32(in + 48));
            U32TO8(out + 52, x[13] ^ U8TO32(in + 52));
            U32TO8(out + 56, x[14] ^ U8TO32(in + 56));
            U32TO8(out + 60, x[15] ^ U8TO32(in + 60));
            in += 64;
        } else {
            U32TO8(out +  0,  x[0]);
            U32TO8(out +  4,  x[1]);
            U32TO8(out +  8,  x[2]);
            U32TO8(out + 12,  x[3]);
            U32TO8(out + 16,  x[4]);
            U32TO8(out + 20,  x[5]);
            U32TO8(out + 24,  x[6]);
            U32TO8(out + 28,  x[7]);
            U32TO8(out + 32,  x[8]);
            U32TO8(out + 36,  x[9]);
            U32TO8(out + 40, x[10]);
            U32TO8(out + 44, x[11]);
            U32TO8(out + 48, x[12]);
            U32TO8(out + 52, x[13]);
            U32TO8(out + 56, x[14]);
            U32TO8(out + 60, x[15]);
        }

        /* increment the 64 bit counter, split in to two 32 bit halves */
        j[8]++;
        if (!j[8])
            j[9]++;

        if (bytes <= 64) {
            if (bytes < 64) for (i = 0; i < bytes; i++) ctarget[i] = out[i];

            /* store the counter back to the state */
            U32TO8(state->s + 32, j[8]);
            U32TO8(state->s + 36, j[9]);
            return;
        }
        bytes -= 64;
        out += 64;
    }
}